

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

void __thiscall
slang::ast::DistExpression::serializeTo(DistExpression *this,ASTSerializer *serializer)

{
  string_view name;
  string_view name_00;
  bool bVar1;
  Expression *__n;
  reference pDVar2;
  ASTSerializer *in_RSI;
  DistExpression *in_RDI;
  DistItem *item;
  iterator __end2;
  iterator __begin2;
  span<slang::ast::DistExpression::DistItem,_18446744073709551615UL> *__range2;
  anon_class_8_1_79d3bf50 writeWeight;
  span<slang::ast::DistExpression::DistItem,_18446744073709551615UL> *in_stack_ffffffffffffff58;
  __normal_iterator<slang::ast::DistExpression::DistItem_*,_std::span<slang::ast::DistExpression::DistItem,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff60;
  ASTSerializer *in_stack_ffffffffffffff68;
  ASTSerializer *pAVar3;
  DistWeight *in_stack_ffffffffffffff98;
  anon_class_8_1_79d3bf50 *in_stack_ffffffffffffffa0;
  __normal_iterator<slang::ast::DistExpression::DistItem_*,_std::span<slang::ast::DistExpression::DistItem,_18446744073709551615UL>_>
  local_48;
  span<slang::ast::DistExpression::DistItem,_18446744073709551615UL> *local_40;
  int local_28;
  void *local_20;
  ASTSerializer *local_10;
  
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
             (char *)in_stack_ffffffffffffff68);
  __n = left(in_RDI);
  ASTSerializer::write(in_RSI,local_28,local_20,(size_t)__n);
  pAVar3 = local_10;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
             (char *)in_stack_ffffffffffffff68);
  name_00._M_str = (char *)in_RDI;
  name_00._M_len = (size_t)pAVar3;
  ASTSerializer::startArray(in_RSI,name_00);
  local_40 = &in_RDI->items_;
  local_48._M_current =
       (DistItem *)
       std::span<slang::ast::DistExpression::DistItem,_18446744073709551615UL>::begin
                 (in_stack_ffffffffffffff58);
  std::span<slang::ast::DistExpression::DistItem,_18446744073709551615UL>::end
            ((span<slang::ast::DistExpression::DistItem,_18446744073709551615UL> *)
             in_stack_ffffffffffffff68);
  while (bVar1 = __gnu_cxx::
                 operator==<slang::ast::DistExpression::DistItem_*,_std::span<slang::ast::DistExpression::DistItem,_18446744073709551615UL>_>
                           (in_stack_ffffffffffffff60,
                            (__normal_iterator<slang::ast::DistExpression::DistItem_*,_std::span<slang::ast::DistExpression::DistItem,_18446744073709551615UL>_>
                             *)in_stack_ffffffffffffff58), ((bVar1 ^ 0xffU) & 1) != 0) {
    pDVar2 = __gnu_cxx::
             __normal_iterator<slang::ast::DistExpression::DistItem_*,_std::span<slang::ast::DistExpression::DistItem,_18446744073709551615UL>_>
             ::operator*(&local_48);
    ASTSerializer::startObject((ASTSerializer *)0xf25120);
    in_stack_ffffffffffffff68 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,(char *)local_10);
    ASTSerializer::write
              (in_stack_ffffffffffffff68,(int)in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,
               (size_t)pDVar2->value);
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional<slang::ast::DistExpression::DistWeight> *)0xf25168);
    if (bVar1) {
      std::optional<slang::ast::DistExpression::DistWeight>::operator*
                ((optional<slang::ast::DistExpression::DistWeight> *)0xf2517c);
      serializeTo::anon_class_8_1_79d3bf50::operator()
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    ASTSerializer::endObject((ASTSerializer *)0xf25199);
    __gnu_cxx::
    __normal_iterator<slang::ast::DistExpression::DistItem_*,_std::span<slang::ast::DistExpression::DistItem,_18446744073709551615UL>_>
    ::operator++(&local_48);
  }
  ASTSerializer::endArray((ASTSerializer *)0xf251b5);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<slang::ast::DistExpression::DistWeight> *)0xf251c3);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
               (char *)in_stack_ffffffffffffff68);
    name._M_str = (char *)in_RSI;
    name._M_len = (size_t)in_stack_ffffffffffffff68;
    ASTSerializer::writeProperty(local_10,name);
    ASTSerializer::startObject((ASTSerializer *)0xf25208);
    std::optional<slang::ast::DistExpression::DistWeight>::operator*
              ((optional<slang::ast::DistExpression::DistWeight> *)0xf25216);
    serializeTo::anon_class_8_1_79d3bf50::operator()
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    ASTSerializer::endObject((ASTSerializer *)0xf25233);
  }
  return;
}

Assistant:

void DistExpression::serializeTo(ASTSerializer& serializer) const {
    auto writeWeight = [&](const DistWeight& weight) {
        serializer.write("kind", weight.kind == DistWeight::PerRange ? "PerRange"sv : "PerValue"sv);
        serializer.write("weight", *weight.expr);
    };

    serializer.write("left", left());
    serializer.startArray("items");
    for (auto& item : items_) {
        serializer.startObject();
        serializer.write("value", item.value);
        if (item.weight)
            writeWeight(*item.weight);
        serializer.endObject();
    }
    serializer.endArray();

    if (defaultWeight_) {
        serializer.writeProperty("defaultWeight");
        serializer.startObject();
        writeWeight(*defaultWeight_);
        serializer.endObject();
    }
}